

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  reference pvVar1;
  ostream *poVar2;
  char *pcVar3;
  Float<unsigned_int,_8,_23,_127,_3U> local_54;
  byte local_4e;
  byte local_4d;
  float local_4c;
  bool ref_1;
  int iStack_48;
  bool out0_1;
  float in0_1;
  int compNdx_1;
  float local_3c;
  bool ref;
  int iStack_38;
  bool out0;
  float in0;
  int compNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  IsnanCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  compNdx = glu::VarType::getPrecision(&pvVar1->varType);
  in0 = (float)glu::getDataTypeScalarSize(scalarSize);
  if (compNdx == 2) {
    for (iStack_38 = 0; iStack_38 < (int)in0; iStack_38 = iStack_38 + 1) {
      local_3c = *(float *)((long)*outputs_local + (long)iStack_38 * 4);
      compNdx_1._3_1_ = *(int *)((long)*_precision + (long)iStack_38 * 4) != 0;
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                ((Float<unsigned_int,_8,_23,_127,_3U> *)&in0_1,local_3c);
      compNdx_1._2_1_ =
           tcu::Float<unsigned_int,_8,_23,_127,_3U>::isNaN
                     ((Float<unsigned_int,_8,_23,_127,_3U> *)&in0_1);
      if ((compNdx_1._3_1_ & 1) != compNdx_1._2_1_) {
        poVar2 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_38);
        poVar2 = std::operator<<(poVar2,"] = ");
        pcVar3 = "false";
        if ((compNdx_1._2_1_ & 1) != 0) {
          pcVar3 = "true";
        }
        std::operator<<(poVar2,pcVar3);
        return false;
      }
    }
  }
  else if ((compNdx == 1) || (compNdx == 0)) {
    for (iStack_48 = 0; iStack_48 < (int)in0; iStack_48 = iStack_48 + 1) {
      local_4c = *(float *)((long)*outputs_local + (long)iStack_48 * 4);
      local_4d = *(int *)((long)*_precision + (long)iStack_48 * 4) != 0;
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_54,local_4c);
      local_4e = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isNaN(&local_54);
      if ((!(bool)local_4e) && ((local_4d & 1) != 0)) {
        poVar2 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_48);
        poVar2 = std::operator<<(poVar2,"] = ");
        pcVar3 = "false";
        if ((local_4e & 1) != 0) {
          pcVar3 = "true";
        }
        std::operator<<(poVar2,pcVar3);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP || precision == glu::PRECISION_LOWP)
		{
			// NaN support is optional, check that inputs that are not NaN don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}

		return true;
	}